

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

int begin_get_next_outgoing_id(BEGIN_HANDLE begin,transfer_number *next_outgoing_id_value)

{
  int iVar1;
  AMQP_TYPE AVar2;
  AMQP_VALUE value;
  int get_single_value_result;
  AMQP_VALUE item_value;
  BEGIN_INSTANCE *begin_instance;
  uint32_t item_count;
  int result;
  transfer_number *next_outgoing_id_value_local;
  BEGIN_HANDLE begin_local;
  
  if (begin == (BEGIN_HANDLE)0x0) {
    begin_instance._4_4_ = 0xaa6;
  }
  else {
    _item_count = next_outgoing_id_value;
    next_outgoing_id_value_local = (transfer_number *)begin;
    iVar1 = amqpvalue_get_composite_item_count(begin->composite_value,(uint32_t *)&begin_instance);
    if (iVar1 == 0) {
      if ((uint)begin_instance < 2) {
        begin_instance._4_4_ = 0xab4;
      }
      else {
        value = amqpvalue_get_composite_item_in_place(begin->composite_value,1);
        if ((value == (AMQP_VALUE)0x0) ||
           (AVar2 = amqpvalue_get_type(value), AVar2 == AMQP_TYPE_NULL)) {
          begin_instance._4_4_ = 0xabc;
        }
        else {
          iVar1 = amqpvalue_get_uint(value,_item_count);
          if (iVar1 == 0) {
            begin_instance._4_4_ = 0;
          }
          else {
            begin_instance._4_4_ = 0xac3;
          }
        }
      }
    }
    else {
      begin_instance._4_4_ = 0xaae;
    }
  }
  return begin_instance._4_4_;
}

Assistant:

int begin_get_next_outgoing_id(BEGIN_HANDLE begin, transfer_number* next_outgoing_id_value)
{
    int result;

    if (begin == NULL)
    {
        result = MU_FAILURE;
    }
    else
    {
        uint32_t item_count;
        BEGIN_INSTANCE* begin_instance = (BEGIN_INSTANCE*)begin;
        if (amqpvalue_get_composite_item_count(begin_instance->composite_value, &item_count) != 0)
        {
            result = MU_FAILURE;
        }
        else
        {
            if (item_count <= 1)
            {
                result = MU_FAILURE;
            }
            else
            {
                AMQP_VALUE item_value = amqpvalue_get_composite_item_in_place(begin_instance->composite_value, 1);
                if ((item_value == NULL) ||
                    (amqpvalue_get_type(item_value) == AMQP_TYPE_NULL))
                {
                    result = MU_FAILURE;
                }
                else
                {
                    int get_single_value_result = amqpvalue_get_transfer_number(item_value, next_outgoing_id_value);
                    if (get_single_value_result != 0)
                    {
                        result = MU_FAILURE;
                    }
                    else
                    {
                        result = 0;
                    }
                }
            }
        }
    }

    return result;
}